

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O1

void __thiscall
isocpp_p1950::indirect_value<int,_CopierWithCallback,_std::default_delete<int>_>::indirect_value
          (indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *this,
          indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *i)

{
  int *piVar1;
  
  (this->super_indirect_value_copy_base<CopierWithCallback,_false>).c_.callback.super__Function_base
  ._M_manager = (_Manager_type)0x0;
  (this->super_indirect_value_copy_base<CopierWithCallback,_false>).c_.callback._M_invoker =
       (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->super_indirect_value_copy_base<CopierWithCallback,_false>).c_.callback.
    super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_indirect_value_copy_base<CopierWithCallback,_false>).c_.callback.
           super__Function_base._M_functor + 8) = 0;
  if (i->ptr_ == (int *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = CopierWithCallback::operator()((CopierWithCallback *)i,i->ptr_);
  }
  this->ptr_ = piVar1;
  return;
}

Assistant:

constexpr indirect_value(const indirect_value& i)
      : copy_base(i.get_c()), delete_base(i.get_d()), ptr_(i.make_raw_copy()) {}